

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

string * __thiscall
ftxui::Color::Print_abi_cxx11_(string *__return_storage_ptr__,Color *this,bool is_background_color)

{
  byte bVar1;
  long lVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  long *plVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  string __str;
  string __str_2;
  string __str_3;
  string __str_1;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70 [2];
  ulong local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  switch(this->type_) {
  case Palette1:
    pcVar9 = "39";
    if (is_background_color) {
      pcVar9 = "49";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    if (is_background_color) {
      pcVar8 = "";
    }
    break;
  case Palette16:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               *(char **)((anonymous_namespace)::palette16code +
                         (ulong)is_background_color * 8 + (ulong)(this->field_1).index_ * 0x10),
               (allocator<char> *)&local_110);
    return __return_storage_ptr__;
  case Palette256:
    pcVar8 = "38;5;";
    if (is_background_color) {
      pcVar8 = "48;5;";
    }
    bVar1 = (this->field_1).index_;
    uVar12 = 1;
    if (9 < bVar1) {
      uVar12 = 3 - (bVar1 < 100);
    }
    local_110 = &local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar12);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_110,uVar12,(uint)bVar1);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)pcVar8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_60[0] = local_100;
    puVar11 = local_110;
    if (local_110 == &local_100) {
      return __return_storage_ptr__;
    }
    goto LAB_001550ce;
  case TrueColor:
    pcVar8 = "38;2;";
    if (is_background_color) {
      pcVar8 = "48;2;";
    }
    bVar1 = (this->field_1).index_;
    uVar12 = 1;
    if (9 < bVar1) {
      uVar12 = 3 - (bVar1 < 100);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar12);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70[0],uVar12,(uint)bVar1);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,(ulong)pcVar8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_40 = *plVar7;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar7;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar11 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar11) {
      local_c0 = *puVar11;
      lStack_b8 = plVar4[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar11;
      local_d0 = (ulong *)*plVar4;
    }
    local_c8 = plVar4[1];
    *plVar4 = (long)puVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    bVar1 = this->green_;
    uVar12 = 1;
    if (9 < bVar1) {
      uVar12 = 3 - (bVar1 < 100);
    }
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar12);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,uVar12,(uint)bVar1);
    uVar10 = 0xf;
    if (local_d0 != &local_c0) {
      uVar10 = local_c0;
    }
    if (uVar10 < (ulong)(local_e8 + local_c8)) {
      uVar10 = 0xf;
      if (local_f0 != local_e0) {
        uVar10 = local_e0[0];
      }
      if (uVar10 < (ulong)(local_e8 + local_c8)) goto LAB_00154e53;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00154e53:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
    }
    local_b0 = &local_a0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_a0 = *plVar4;
      uStack_98 = puVar5[3];
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*puVar5;
    }
    local_a8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar11 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar11) {
      local_100 = *puVar11;
      lStack_f8 = plVar4[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *puVar11;
      local_110 = (ulong *)*plVar4;
    }
    local_108 = plVar4[1];
    *plVar4 = (long)puVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    bVar1 = this->blue_;
    uVar12 = 1;
    if (9 < bVar1) {
      uVar12 = 3 - (bVar1 < 100);
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar12);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,uVar12,(uint)bVar1);
    uVar10 = 0xf;
    if (local_110 != &local_100) {
      uVar10 = local_100;
    }
    if (uVar10 < (ulong)(local_88 + local_108)) {
      uVar10 = 0xf;
      if (local_90 != local_80) {
        uVar10 = local_80[0];
      }
      if (uVar10 < (ulong)(local_88 + local_108)) goto LAB_00154fa7;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_110);
    }
    else {
LAB_00154fa7:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_90);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar6) {
      uVar3 = puVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = puVar5[1];
    *puVar5 = psVar6;
    puVar5[1] = 0;
    *(undefined1 *)psVar6 = 0;
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    puVar11 = local_70[0];
    if (local_70[0] == local_60) {
      return __return_storage_ptr__;
    }
LAB_001550ce:
    operator_delete(puVar11,local_60[0] + 1);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    pcVar9 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::Print(bool is_background_color) const {
  switch (type_) {
    case ColorType::Palette1:
      return is_background_color ? "49" : "39";

    case ColorType::Palette16:
      return palette16code[index_][is_background_color];

    case ColorType::Palette256:
      return (is_background_color ? "48;5;" : "38;5;") + std::to_string(index_);

    case ColorType::TrueColor:
      return (is_background_color ? "48;2;" : "38;2;")  //
             + std::to_string(red_) + ";"               //
             + std::to_string(green_) + ";"             //
             + std::to_string(blue_);                   //
  }
  return "";
}